

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O1

void __thiscall Assimp::Discreet3DSImporter::ReplaceDefaultMaterial(Discreet3DSImporter *this)

{
  ai_real *paVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  Logger *pLVar6;
  Scene *pSVar7;
  pointer pMVar8;
  ulong uVar9;
  char *pcVar10;
  pointer pMVar11;
  uint *puVar12;
  string *psVar13;
  ulong uVar14;
  bool bVar15;
  Material sMat;
  uint local_30c;
  string local_308;
  Material local_2e8;
  
  pSVar7 = this->mScene;
  pMVar8 = (pSVar7->mMaterials).
           super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pSVar7->mMaterials).
      super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>._M_impl.
      super__Vector_impl_data._M_finish == pMVar8) {
    uVar14 = 0;
    local_30c = 0xcdcdcdcd;
  }
  else {
    uVar5 = 0;
    local_30c = 0xcdcdcdcd;
    do {
      psVar13 = &pMVar8[uVar5].mName;
      if (pMVar8[uVar5].mName._M_string_length != 0) {
        pcVar10 = (psVar13->_M_dataplus)._M_p;
        do {
          iVar3 = tolower((int)*pcVar10);
          *pcVar10 = (char)iVar3;
          pcVar10 = pcVar10 + 1;
        } while (pcVar10 != (psVar13->_M_dataplus)._M_p + pMVar8[uVar5].mName._M_string_length);
      }
      lVar4 = std::__cxx11::string::find((char *)psVar13,0x697528,0);
      if (lVar4 != -1) {
        pMVar8 = (this->mScene->mMaterials).
                 super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        fVar2 = pMVar8[uVar5].mDiffuse.r;
        if (fVar2 == pMVar8[uVar5].mDiffuse.g) {
          paVar1 = &pMVar8[uVar5].mDiffuse.b;
          if (((((fVar2 == *paVar1) && (!NAN(fVar2) && !NAN(*paVar1))) &&
               (*(size_type *)((long)&pMVar8[uVar5].sTexDiffuse.mMapName + 8) == 0)) &&
              ((*(size_type *)((long)&pMVar8[uVar5].sTexBump.mMapName + 8) == 0 &&
               (*(size_type *)((long)&pMVar8[uVar5].sTexOpacity.mMapName + 8) == 0)))) &&
             ((*(size_type *)((long)&pMVar8[uVar5].sTexEmissive.mMapName + 8) == 0 &&
              ((*(size_type *)((long)&pMVar8[uVar5].sTexSpecular.mMapName + 8) == 0 &&
               (*(size_type *)((long)&pMVar8[uVar5].sTexShininess.mMapName + 8) == 0)))))) {
            local_30c = (uint)uVar5;
          }
        }
      }
      uVar5 = (ulong)((uint)uVar5 + 1);
      pSVar7 = this->mScene;
      pMVar8 = (pSVar7->mMaterials).
               super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(pSVar7->mMaterials).
                      super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
               0x66fd0eb66fd0eb67;
    } while (uVar5 <= uVar14 && uVar14 - uVar5 != 0);
  }
  uVar14 = uVar14 & 0xffffffff;
  if (local_30c != 0xcdcdcdcd) {
    uVar14 = (ulong)local_30c;
  }
  pMVar11 = (pSVar7->mMeshes).
            super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar7 = this->mScene;
  if (pMVar11 ==
      (pSVar7->mMeshes).super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar15 = true;
  }
  else {
    iVar3 = 0;
    do {
      for (puVar12 = (pMVar11->mFaceMaterials).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          puVar12 !=
          (pMVar11->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish; puVar12 = puVar12 + 1) {
        uVar5 = (ulong)*puVar12;
        if (uVar5 == 0xcdcdcdcd) {
          *puVar12 = (uint)uVar14;
LAB_0067642d:
          iVar3 = iVar3 + 1;
        }
        else {
          uVar9 = ((long)(this->mScene->mMaterials).
                         super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->mScene->mMaterials).
                         super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x66fd0eb66fd0eb67;
          if (uVar9 < uVar5 || uVar9 - uVar5 == 0) {
            *puVar12 = (uint)uVar14;
            pLVar6 = DefaultLogger::get();
            Logger::warn(pLVar6,"Material index overflow in 3DS file. Using default material");
            goto LAB_0067642d;
          }
        }
      }
      pMVar11 = pMVar11 + 1;
      pSVar7 = this->mScene;
    } while (pMVar11 !=
             (pSVar7->mMeshes).
             super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
             super__Vector_impl_data._M_finish);
    bVar15 = iVar3 == 0;
  }
  if ((!bVar15) &&
     (((long)(pSVar7->mMaterials).
             super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(pSVar7->mMaterials).
             super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3) * 0x66fd0eb66fd0eb67 - uVar14 == 0)) {
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"%%%DEFAULT","");
    D3DS::Material::Material(&local_2e8,&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    local_2e8.mDiffuse.r = 0.3;
    local_2e8.mDiffuse.g = 0.3;
    local_2e8.mDiffuse.b = 0.3;
    std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::push_back
              (&this->mScene->mMaterials,&local_2e8);
    pLVar6 = DefaultLogger::get();
    Logger::info(pLVar6,"3DS: Generating default material");
    D3DS::Material::~Material(&local_2e8);
  }
  return;
}

Assistant:

void Discreet3DSImporter::ReplaceDefaultMaterial()
{
    // Try to find an existing material that matches the
    // typical default material setting:
    // - no textures
    // - diffuse color (in grey!)
    // NOTE: This is here to workaround the fact that some
    // exporters are writing a default material, too.
    unsigned int idx( NotSet );
    for (unsigned int i = 0; i < mScene->mMaterials.size();++i)
    {
        std::string &s = mScene->mMaterials[i].mName;
        for ( std::string::iterator it = s.begin(); it != s.end(); ++it ) {
            *it = static_cast< char >( ::tolower( *it ) );
        }

        if (std::string::npos == s.find("default"))continue;

        if (mScene->mMaterials[i].mDiffuse.r !=
            mScene->mMaterials[i].mDiffuse.g ||
            mScene->mMaterials[i].mDiffuse.r !=
            mScene->mMaterials[i].mDiffuse.b)continue;

        if (mScene->mMaterials[i].sTexDiffuse.mMapName.length()   != 0  ||
            mScene->mMaterials[i].sTexBump.mMapName.length()      != 0  ||
            mScene->mMaterials[i].sTexOpacity.mMapName.length()   != 0  ||
            mScene->mMaterials[i].sTexEmissive.mMapName.length()  != 0  ||
            mScene->mMaterials[i].sTexSpecular.mMapName.length()  != 0  ||
            mScene->mMaterials[i].sTexShininess.mMapName.length() != 0 )
        {
            continue;
        }
        idx = i;
    }
    if ( NotSet == idx ) {
        idx = ( unsigned int )mScene->mMaterials.size();
    }

    // now iterate through all meshes and through all faces and
    // find all faces that are using the default material
    unsigned int cnt = 0;
    for (std::vector<D3DS::Mesh>::iterator
        i =  mScene->mMeshes.begin();
        i != mScene->mMeshes.end();++i)
    {
        for (std::vector<unsigned int>::iterator
            a =  (*i).mFaceMaterials.begin();
            a != (*i).mFaceMaterials.end();++a)
        {
            // NOTE: The additional check seems to be necessary,
            // some exporters seem to generate invalid data here
            if (0xcdcdcdcd == (*a))
            {
                (*a) = idx;
                ++cnt;
            }
            else if ( (*a) >= mScene->mMaterials.size())
            {
                (*a) = idx;
                ASSIMP_LOG_WARN("Material index overflow in 3DS file. Using default material");
                ++cnt;
            }
        }
    }
    if (cnt && idx == mScene->mMaterials.size())
    {
        // We need to create our own default material
        D3DS::Material sMat("%%%DEFAULT");
        sMat.mDiffuse = aiColor3D(0.3f,0.3f,0.3f);
        mScene->mMaterials.push_back(sMat);

        ASSIMP_LOG_INFO("3DS: Generating default material");
    }
}